

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynVariableDefinitions * ParseVariableDefinitions(ParseContext *ctx,bool classMembers)

{
  Lexeme *begin;
  IntrusiveList<SynVariableDefinition> definitions_00;
  bool bVar1;
  LexemeType LVar2;
  SynAlign *align_00;
  SynVariableDefinition *pSVar3;
  Lexeme *pLVar4;
  SynVariableDefinition *definition;
  IntrusiveList<SynVariableDefinition> definitions;
  SynBase *type;
  SynAlign *align;
  Lexeme *start;
  bool classMembers_local;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  align_00 = ParseAlign(ctx);
  definitions.tail = (SynVariableDefinition *)ParseType(ctx,(bool *)0x0,false);
  if (definitions.tail == (SynVariableDefinition *)0x0) {
    ctx->currentLexeme = begin;
    ctx_local = (ParseContext *)0x0;
  }
  else {
    IntrusiveList<SynVariableDefinition>::IntrusiveList
              ((IntrusiveList<SynVariableDefinition> *)&definition);
    pSVar3 = ParseVariableDefinition(ctx);
    if (pSVar3 == (SynVariableDefinition *)0x0) {
      if (align_00 != (SynAlign *)0x0) {
        pLVar4 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report
                  (ctx,pLVar4,
                   "ERROR: variable or class definition is expected after alignment specifier");
      }
      ctx->currentLexeme = begin;
      ctx_local = (ParseContext *)0x0;
    }
    else {
      IntrusiveList<SynVariableDefinition>::push_back
                ((IntrusiveList<SynVariableDefinition> *)&definition,pSVar3);
      while (bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1) {
        pSVar3 = ParseVariableDefinition(ctx);
        if (pSVar3 == (SynVariableDefinition *)0x0) {
          if (classMembers) {
            pLVar4 = ParseContext::Current(ctx);
            anon_unknown.dwarf_104b6::Report(ctx,pLVar4,"ERROR: member name expected after \',\'");
          }
          else {
            pLVar4 = ParseContext::Current(ctx);
            anon_unknown.dwarf_104b6::Report
                      (ctx,pLVar4,"ERROR: next variable definition excepted after \',\'");
          }
          break;
        }
        IntrusiveList<SynVariableDefinition>::push_back
                  ((IntrusiveList<SynVariableDefinition> *)&definition,pSVar3);
      }
      if (classMembers) {
        anon_unknown.dwarf_104b6::CheckConsume
                  (ctx,lex_semicolon,"ERROR: \';\' not found after class member list");
      }
      else {
        bVar1 = ParseContext::Consume(ctx,lex_semicolon);
        if (!bVar1) {
          LVar2 = ParseContext::Peek(ctx);
          if (LVar2 == lex_obracket) {
            anon_unknown.dwarf_104b6::CheckConsume
                      (ctx,lex_semicolon,"ERROR: array size must be specified after type name");
          }
          else {
            anon_unknown.dwarf_104b6::CheckConsume
                      (ctx,lex_semicolon,"ERROR: \';\' not found after variable definition");
          }
        }
      }
      ctx_local = (ParseContext *)ParseContext::get<SynVariableDefinitions>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      definitions_00.tail = definitions.head;
      definitions_00.head = definition;
      SynVariableDefinitions::SynVariableDefinitions
                ((SynVariableDefinitions *)ctx_local,begin,pLVar4,align_00,
                 &(definitions.tail)->super_SynBase,definitions_00);
    }
  }
  return (SynVariableDefinitions *)ctx_local;
}

Assistant:

SynVariableDefinitions* ParseVariableDefinitions(ParseContext &ctx, bool classMembers)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(SynBase *type = ParseType(ctx))
	{
		IntrusiveList<SynVariableDefinition> definitions;

		SynVariableDefinition *definition = ParseVariableDefinition(ctx);

		if(!definition)
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: variable or class definition is expected after alignment specifier");

			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		definitions.push_back(definition);

		while(ctx.Consume(lex_comma))
		{
			definition = ParseVariableDefinition(ctx);

			if(!definition)
			{
				if(classMembers)
					Report(ctx, ctx.Current(), "ERROR: member name expected after ','");
				else
					Report(ctx, ctx.Current(), "ERROR: next variable definition excepted after ','");

				break;
			}

			definitions.push_back(definition);
		}

		if(classMembers)
		{
			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			if(ctx.Peek() == lex_obracket)
				CheckConsume(ctx, lex_semicolon, "ERROR: array size must be specified after type name");
			else
				CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after variable definition");
		}

		return new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), align, type, definitions);
	}
	
	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}